

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnExport
          (BinaryReaderObjdump *this,Index index,ExternalKind kind,Index item_index,string_view name
          )

{
  char *pcVar1;
  string_view sVar2;
  
  if ((int)kind < 5) {
    pcVar1 = *(char **)(g_kind_name + (long)(int)kind * 8);
  }
  else {
    pcVar1 = "<error_kind>";
  }
  PrintDetails(this," - %s[%u]",pcVar1,(ulong)item_index);
  if (kind == First) {
    sVar2 = BinaryReaderObjdumpBase::GetFunctionName
                      (&this->super_BinaryReaderObjdumpBase,item_index);
    if (sVar2.size_ != 0) {
      PrintDetails(this," <%.*s>",sVar2.size_,sVar2.data_);
    }
  }
  PrintDetails(this," -> \"%.*s\"\n",name.size_ & 0xffffffff,name.data_);
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnExport(Index index,
                                     ExternalKind kind,
                                     Index item_index,
                                     string_view name) {
  PrintDetails(" - %s[%" PRIindex "]", GetKindName(kind), item_index);
  if (kind == ExternalKind::Func) {
    auto name = GetFunctionName(item_index);
    if (!name.empty()) {
      PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
    }
  }

  PrintDetails(" -> \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(name));
  return Result::Ok;
}